

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

ssize_t mqtt_unpack_publish_response(mqtt_response *mqtt_response,uint8_t *buf)

{
  uint16_t uVar1;
  mqtt_response_publish *response;
  mqtt_fixed_header *fixed_header;
  uint8_t *start;
  uint8_t *buf_local;
  mqtt_response *mqtt_response_local;
  
  (mqtt_response->decoded).connack.session_present_flag =
       (uint8_t)((int)(((mqtt_response->fixed_header).field_0x4 & 0xf) & 8) >> 3);
  (mqtt_response->decoded).publish.qos_level =
       (uint8_t)((int)(((mqtt_response->fixed_header).field_0x4 & 0xf) & 6) >> 1);
  (mqtt_response->decoded).publish.retain_flag = (mqtt_response->fixed_header).field_0x4 & 1;
  if ((mqtt_response->fixed_header).remaining_length < 4) {
    mqtt_response_local = (mqtt_response *)0xffffffff8000000c;
  }
  else {
    uVar1 = __mqtt_unpack_uint16(buf);
    (mqtt_response->decoded).publish.topic_name_size = uVar1;
    (mqtt_response->decoded).suback.return_codes = buf + 2;
    start = buf + 2 + (int)(uint)(mqtt_response->decoded).publish.topic_name_size;
    if ((mqtt_response->decoded).publish.qos_level != '\0') {
      uVar1 = __mqtt_unpack_uint16(start);
      (mqtt_response->decoded).publish.packet_id = uVar1;
      start = start + 2;
    }
    (mqtt_response->decoded).publish.application_message = start;
    if ((mqtt_response->decoded).publish.qos_level == '\0') {
      *(ulong *)((long)&mqtt_response->decoded + 0x20) =
           (ulong)(((mqtt_response->fixed_header).remaining_length -
                   (uint)(mqtt_response->decoded).publish.topic_name_size) - 2);
    }
    else {
      *(ulong *)((long)&mqtt_response->decoded + 0x20) =
           (ulong)(((mqtt_response->fixed_header).remaining_length -
                   (uint)(mqtt_response->decoded).publish.topic_name_size) - 4);
    }
    mqtt_response_local =
         (mqtt_response *)
         (start + ((mqtt_response->decoded).publish.application_message_size - (long)buf));
  }
  return (ssize_t)mqtt_response_local;
}

Assistant:

ssize_t mqtt_unpack_publish_response(struct mqtt_response *mqtt_response, const uint8_t *buf)
{    
    const uint8_t *const start = buf;
    struct mqtt_fixed_header *fixed_header;
    struct mqtt_response_publish *response;
    
    fixed_header = &(mqtt_response->fixed_header);
    response = &(mqtt_response->decoded.publish);

    /* get flags */
    response->dup_flag = (fixed_header->control_flags & MQTT_PUBLISH_DUP) >> 3;
    response->qos_level = (fixed_header->control_flags & MQTT_PUBLISH_QOS_MASK) >> 1;
    response->retain_flag = fixed_header->control_flags & MQTT_PUBLISH_RETAIN;

    /* make sure that remaining length is valid */
    if (mqtt_response->fixed_header.remaining_length < 4) {
        return MQTT_ERROR_MALFORMED_RESPONSE;
    }

    /* parse variable header */
    response->topic_name_size = __mqtt_unpack_uint16(buf);
    buf += 2;
    response->topic_name = buf;
    buf += response->topic_name_size;

    if (response->qos_level > 0) {
        response->packet_id = __mqtt_unpack_uint16(buf);
        buf += 2;
    }

    /* get payload */
    response->application_message = buf;
    if (response->qos_level == 0) {
        response->application_message_size = fixed_header->remaining_length - response->topic_name_size - 2;
    } else {
        response->application_message_size = fixed_header->remaining_length - response->topic_name_size - 4;
    }
    buf += response->application_message_size;
    
    /* return number of bytes consumed */
    return buf - start;
}